

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileContainingSymbol
          (MergedDescriptorDatabase *this,StringViewArg symbol_name,FileDescriptorProto *output)

{
  value_type pDVar1;
  undefined8 uVar2;
  uint uVar3;
  size_type sVar4;
  reference ppDVar5;
  string *psVar6;
  size_type local_130;
  size_t j;
  FileDescriptorProto temp;
  size_t i;
  FileDescriptorProto *output_local;
  StringViewArg symbol_name_local;
  MergedDescriptorDatabase *this_local;
  
  temp.field_0._224_8_ = 0;
  while( true ) {
    uVar2 = temp.field_0._224_8_;
    sVar4 = std::
            vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ::size(&this->sources_);
    if (sVar4 <= (ulong)uVar2) {
      return false;
    }
    ppDVar5 = std::
              vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              ::operator[](&this->sources_,temp.field_0._224_8_);
    uVar3 = (*(*ppDVar5)->_vptr_DescriptorDatabase[3])(*ppDVar5,symbol_name,output);
    if ((uVar3 & 1) != 0) break;
    temp.field_0._224_8_ = temp.field_0._224_8_ + 1;
  }
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&j);
  local_130 = 0;
  do {
    if ((ulong)temp.field_0._224_8_ <= local_130) {
      this_local._7_1_ = true;
LAB_0030faaa:
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&j);
      return this_local._7_1_;
    }
    ppDVar5 = std::
              vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              ::operator[](&this->sources_,local_130);
    pDVar1 = *ppDVar5;
    psVar6 = FileDescriptorProto::name_abi_cxx11_(output);
    uVar3 = (*pDVar1->_vptr_DescriptorDatabase[2])(pDVar1,psVar6,&j);
    if ((uVar3 & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0030faaa;
    }
    local_130 = local_130 + 1;
  } while( true );
}

Assistant:

bool MergedDescriptorDatabase::FindFileContainingSymbol(
    StringViewArg symbol_name, FileDescriptorProto* PROTOBUF_NONNULL output) {
  for (size_t i = 0; i < sources_.size(); i++) {
    if (sources_[i]->FindFileContainingSymbol(symbol_name, output)) {
      // The symbol was found in source i.  However, if one of the previous
      // sources defines a file with the same name (which presumably doesn't
      // contain the symbol, since it wasn't found in that source), then we
      // must hide it from the caller.
      FileDescriptorProto temp;
      for (size_t j = 0; j < i; j++) {
        if (sources_[j]->FindFileByName(output->name(), &temp)) {
          // Found conflicting file in a previous source.
          return false;
        }
      }
      return true;
    }
  }
  return false;
}